

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

int spng_set_unknown_chunks(spng_ctx *ctx,spng_unknown_chunk *chunks,uint32_t n_chunks)

{
  undefined1 *puVar1;
  int iVar2;
  spng_chunk_bitfield sVar3;
  ulong uVar4;
  spng_location *psVar5;
  long lVar6;
  
  if (n_chunks == 0) {
    return 1;
  }
  if (chunks == (spng_unknown_chunk *)0x0 || ctx == (spng_ctx *)0x0) {
LAB_00109f4a:
    iVar2 = 1;
  }
  else if (((ctx->data != (uchar *)0x0) || (iVar2 = 0x52, (ctx->field_0xcc & 0x10) != 0)) &&
          (iVar2 = read_chunks(ctx,0), iVar2 == 0)) {
    uVar4 = (ulong)n_chunks;
    psVar5 = &chunks->location;
    do {
      if (0x7fffffff < *(ulong *)(psVar5 + -4)) {
        return 0x4f;
      }
      if ((*(ulong *)(psVar5 + -4) != 0) && (*(void **)(psVar5 + -2) == (void *)0x0))
      goto LAB_00109f4a;
      if (SPNG_AFTER_IDAT < *psVar5) {
        return 0x10;
      }
      if ((0x106U >> (*psVar5 & 0x1f) & 1) == 0) {
        return 0x10;
      }
      psVar5 = psVar5 + 8;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    sVar3 = ctx->stored;
    if ((((uint)sVar3 >> 0x10 & 1) != 0) && (((ctx->user).field_0x2 & 1) == 0)) {
      if (ctx->n_chunks != 0) {
        lVar6 = 0x10;
        uVar4 = 0;
        do {
          (*(ctx->alloc).free_fn)(*(void **)(ctx->chunk_list->type + lVar6));
          uVar4 = uVar4 + 1;
          lVar6 = lVar6 + 0x20;
        } while (uVar4 < ctx->n_chunks);
      }
      (*(ctx->alloc).free_fn)(ctx->chunk_list);
      sVar3 = ctx->stored;
    }
    ctx->chunk_list = chunks;
    ctx->n_chunks = n_chunks;
    ctx->stored = (spng_chunk_bitfield)((uint)sVar3 | 0x10000);
    puVar1 = &(ctx->user).field_0x2;
    *puVar1 = *puVar1 | 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int spng_set_unknown_chunks(spng_ctx *ctx, struct spng_unknown_chunk *chunks, uint32_t n_chunks)
{
    if(!n_chunks) return 1;
    SPNG_SET_CHUNK_BOILERPLATE(chunks);

    uint32_t i;
    for(i=0; i < n_chunks; i++)
    {
        if(chunks[i].length > spng_u32max) return SPNG_ECHUNK_STDLEN;
        if(chunks[i].length && chunks[i].data == NULL) return 1;

        switch(chunks[i].location)
        {
            case SPNG_AFTER_IHDR:
            case SPNG_AFTER_PLTE:
            case SPNG_AFTER_IDAT:
            break;
            default: return SPNG_ECHUNK_POS;
        }
    }

    if(ctx->stored.unknown && !ctx->user.unknown)
    {
        for(i=0; i < ctx->n_chunks; i++)
        {
            spng__free(ctx, ctx->chunk_list[i].data);
        }
        spng__free(ctx, ctx->chunk_list);
    }

    ctx->chunk_list = chunks;
    ctx->n_chunks = n_chunks;

    ctx->stored.unknown = 1;
    ctx->user.unknown = 1;

    return 0;
}